

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImVec2 size_expected;
  ImVec2 local_30;
  ImVec2 local_28;
  undefined8 uStack_20;
  
  fVar1 = corner_target->x;
  fVar2 = corner_target->y;
  fVar4 = (window->Pos).x;
  fVar5 = (window->Pos).y;
  fVar6 = (fVar4 - fVar1) * corner_norm->x + fVar1;
  local_30.y = (fVar5 - fVar2) * corner_norm->y + fVar2;
  fVar4 = fVar4 + (window->Size).x;
  fVar5 = fVar5 + (window->Size).y;
  local_30.x = ((fVar1 - fVar4) * corner_norm->x + fVar4) - fVar6;
  local_28.y = local_30.y;
  local_28.x = fVar6;
  uStack_20 = 0;
  local_30.y = ((fVar2 - fVar5) * corner_norm->y + fVar5) - local_30.y;
  IVar3 = CalcWindowSizeAfterConstraint(window,&local_30);
  *out_pos = local_28;
  if ((corner_norm->x == 0.0) && (!NAN(corner_norm->x))) {
    out_pos->x = out_pos->x - (IVar3.x - local_30.x);
  }
  if ((corner_norm->y == 0.0) && (!NAN(corner_norm->y))) {
    out_pos->y = out_pos->y - (IVar3.y - local_30.y);
  }
  *out_size = IVar3;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}